

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O3

void duckdb_brotli::BrotliDecoderStateCleanupAfterMetablock(BrotliDecoderStateInternal *s)

{
  (*s->free_func)(s->memory_manager_opaque,s->context_modes);
  s->context_modes = (uint8_t *)0x0;
  (*s->free_func)(s->memory_manager_opaque,s->context_map);
  s->context_map = (uint8_t *)0x0;
  (*s->free_func)(s->memory_manager_opaque,s->dist_context_map);
  s->dist_context_map = (uint8_t *)0x0;
  (*s->free_func)(s->memory_manager_opaque,(s->literal_hgroup).htrees);
  (s->literal_hgroup).htrees = (HuffmanCode **)0x0;
  (*s->free_func)(s->memory_manager_opaque,(s->insert_copy_hgroup).htrees);
  (s->insert_copy_hgroup).htrees = (HuffmanCode **)0x0;
  (*s->free_func)(s->memory_manager_opaque,(s->distance_hgroup).htrees);
  (s->distance_hgroup).htrees = (HuffmanCode **)0x0;
  return;
}

Assistant:

void duckdb_brotli::BrotliDecoderStateCleanupAfterMetablock(BrotliDecoderState* s) {
  BROTLI_DECODER_FREE(s, s->context_modes);
  BROTLI_DECODER_FREE(s, s->context_map);
  BROTLI_DECODER_FREE(s, s->dist_context_map);
  BROTLI_DECODER_FREE(s, s->literal_hgroup.htrees);
  BROTLI_DECODER_FREE(s, s->insert_copy_hgroup.htrees);
  BROTLI_DECODER_FREE(s, s->distance_hgroup.htrees);
}